

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

void __thiscall re2::RE2::Init(RE2 *this,StringPiece *pattern,Options *options)

{
  Options *__t;
  bool bVar1;
  ParseFlags global_flags;
  RegexpStatusCode code;
  ErrorCode EVar2;
  int iVar3;
  string *psVar4;
  Regexp *pRVar5;
  ostream *poVar6;
  ostream *poVar7;
  string *__return_storage_ptr__;
  StringPiece *__t_00;
  int64_t iVar8;
  Prog *pPVar9;
  double __x;
  double __x_00;
  ostream *in_stack_fffffffffffffb30;
  allocator<char> local_401;
  StringPiece local_400;
  re2 local_3f0 [32];
  LogMessage local_3d0;
  Regexp *local_250;
  Regexp *suffix;
  undefined4 local_240;
  undefined1 local_23a;
  bool foldcase;
  string local_238;
  StringPiece local_218;
  re2 local_208 [32];
  LogMessage local_1e8;
  StringPiece local_68;
  undefined1 local_58 [8];
  RegexpStatus status;
  allocator<char> local_22;
  anon_class_1_0_00000001 local_21;
  Options *local_20;
  Options *options_local;
  StringPiece *pattern_local;
  RE2 *this_local;
  
  local_20 = options;
  options_local = (Options *)pattern;
  pattern_local = (StringPiece *)this;
  std::call_once<re2::RE2::Init(re2::StringPiece_const&,re2::RE2::Options_const&)::__0>
            (&Init::empty_once,&local_21);
  psVar4 = (string *)operator_new((size_t)in_stack_fffffffffffffb30);
  __t = options_local;
  status.tmp_._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<re2::StringPiece,void>((string *)psVar4,(StringPiece *)__t,&local_22)
  ;
  status.tmp_._3_1_ = 0;
  this->pattern_ = psVar4;
  std::allocator<char>::~allocator(&local_22);
  Options::Copy(&this->options_,local_20);
  this->entire_regexp_ = (Regexp *)0x0;
  this->suffix_regexp_ = (Regexp *)0x0;
  psVar4 = empty_string_abi_cxx11_();
  this->error_ = psVar4;
  psVar4 = empty_string_abi_cxx11_();
  this->error_arg_ = psVar4;
  this->num_captures_ = -1;
  *(uint *)&this->field_0x44 = *(uint *)&this->field_0x44 & 0xe0000000;
  bVar1 = Options::longest_match(&this->options_);
  *(uint *)&this->field_0x44 = *(uint *)&this->field_0x44 & 0xdfffffff | (uint)bVar1 << 0x1d;
  this->field_0x47 = this->field_0x47 & 0xbf;
  this->field_0x47 = this->field_0x47 & 0x7f;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            (&this->prefix_);
  this->prog_ = (Prog *)0x0;
  this->rprog_ = (Prog *)0x0;
  this->named_groups_ =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        *)0x0;
  this->group_names_ =
       (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)0x0;
  RegexpStatus::RegexpStatus((RegexpStatus *)local_58);
  StringPiece::StringPiece(&local_68,(string *)this->pattern_);
  global_flags = Options::ParseFlags(&this->options_);
  pRVar5 = Regexp::Parse(&local_68,global_flags,(RegexpStatus *)local_58);
  this->entire_regexp_ = pRVar5;
  if (this->entire_regexp_ == (Regexp *)0x0) {
    bVar1 = Options::log_errors(&this->options_);
    if (bVar1) {
      LogMessage::LogMessage
                (&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/re2.cc"
                 ,0xe7);
      poVar6 = LogMessage::stream(&local_1e8);
      poVar7 = std::operator<<((ostream *)poVar6,"Error parsing \'");
      StringPiece::StringPiece(&local_218,(string *)this->pattern_);
      trunc_abi_cxx11_(local_208,__x);
      poVar7 = std::operator<<(poVar7,(string *)local_208);
      poVar7 = std::operator<<(poVar7,"\': ");
      RegexpStatus::Text_abi_cxx11_(&local_238,(RegexpStatus *)local_58);
      std::operator<<(poVar7,(string *)&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)local_208);
      LogMessage::~LogMessage(&local_1e8);
    }
    __return_storage_ptr__ = (string *)operator_new((size_t)in_stack_fffffffffffffb30);
    RegexpStatus::Text_abi_cxx11_(__return_storage_ptr__,(RegexpStatus *)local_58);
    this->error_ = (string *)__return_storage_ptr__;
    code = RegexpStatus::code((RegexpStatus *)local_58);
    EVar2 = RegexpErrorToRE2(code);
    *(ErrorCode *)&this->field_0x44 =
         *(ErrorCode *)&this->field_0x44 & 0xe0000000 | EVar2 & 0x1fffffff;
    psVar4 = (string *)operator_new((size_t)in_stack_fffffffffffffb30);
    local_23a = 1;
    __t_00 = RegexpStatus::error_arg((RegexpStatus *)local_58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<re2::StringPiece,void>
              ((string *)psVar4,__t_00,(allocator<char> *)&foldcase);
    local_23a = 0;
    this->error_arg_ = psVar4;
    std::allocator<char>::~allocator((allocator<char> *)&foldcase);
    local_240 = 1;
  }
  else {
    bVar1 = Regexp::RequiredPrefix
                      (this->entire_regexp_,(string *)&this->prefix_,(bool *)((long)&suffix + 7),
                       &local_250);
    if (bVar1) {
      *(uint *)&this->field_0x44 =
           *(uint *)&this->field_0x44 & 0x7fffffff | (uint)(suffix._7_1_ & 1) << 0x1f;
      this->suffix_regexp_ = local_250;
    }
    else {
      pRVar5 = Regexp::Incref(this->entire_regexp_);
      this->suffix_regexp_ = pRVar5;
    }
    pRVar5 = this->suffix_regexp_;
    iVar8 = Options::max_mem(&this->options_);
    pPVar9 = Regexp::CompileToProg(pRVar5,(iVar8 * 2) / 3);
    this->prog_ = pPVar9;
    if (this->prog_ == (Prog *)0x0) {
      bVar1 = Options::log_errors(&this->options_);
      if (bVar1) {
        LogMessage::LogMessage
                  (&local_3d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/re2.cc"
                   ,0x100);
        in_stack_fffffffffffffb30 = LogMessage::stream(&local_3d0);
        poVar7 = std::operator<<((ostream *)in_stack_fffffffffffffb30,"Error compiling \'");
        StringPiece::StringPiece(&local_400,(string *)this->pattern_);
        trunc_abi_cxx11_(local_3f0,__x_00);
        poVar7 = std::operator<<(poVar7,(string *)local_3f0);
        std::operator<<(poVar7,"\'");
        std::__cxx11::string::~string((string *)local_3f0);
        LogMessage::~LogMessage(&local_3d0);
      }
      psVar4 = (string *)operator_new((size_t)in_stack_fffffffffffffb30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)psVar4,"pattern too large - compile failed",&local_401);
      this->error_ = psVar4;
      std::allocator<char>::~allocator(&local_401);
      *(uint *)&this->field_0x44 = *(uint *)&this->field_0x44 & 0xe0000000 | 0xf;
      local_240 = 1;
    }
    else {
      iVar3 = Regexp::NumCaptures(this->suffix_regexp_);
      this->num_captures_ = iVar3;
      bVar1 = Prog::IsOnePass(this->prog_);
      *(uint *)&this->field_0x44 = *(uint *)&this->field_0x44 & 0xbfffffff | (uint)bVar1 << 0x1e;
      local_240 = 0;
    }
  }
  RegexpStatus::~RegexpStatus((RegexpStatus *)local_58);
  return;
}

Assistant:

void RE2::Init(const StringPiece& pattern, const Options& options) {
  static std::once_flag empty_once;
  std::call_once(empty_once, []() {
    (void) new (empty_storage) EmptyStorage;
  });

  pattern_ = new std::string(pattern);
  options_.Copy(options);
  entire_regexp_ = NULL;
  suffix_regexp_ = NULL;
  error_ = empty_string();
  error_arg_ = empty_string();

  num_captures_ = -1;
  error_code_ = NoError;
  longest_match_ = options_.longest_match();
  is_one_pass_ = false;
  prefix_foldcase_ = false;
  prefix_.clear();
  prog_ = NULL;

  rprog_ = NULL;
  named_groups_ = NULL;
  group_names_ = NULL;

  RegexpStatus status;
  entire_regexp_ = Regexp::Parse(
    *pattern_,
    static_cast<Regexp::ParseFlags>(options_.ParseFlags()),
    &status);
  if (entire_regexp_ == NULL) {
    if (options_.log_errors()) {
      LOG(ERROR) << "Error parsing '" << trunc(*pattern_) << "': "
                 << status.Text();
    }
    error_ = new std::string(status.Text());
    error_code_ = RegexpErrorToRE2(status.code());
    error_arg_ = new std::string(status.error_arg());
    return;
  }

  bool foldcase;
  re2::Regexp* suffix;
  if (entire_regexp_->RequiredPrefix(&prefix_, &foldcase, &suffix)) {
    prefix_foldcase_ = foldcase;
    suffix_regexp_ = suffix;
  }
  else {
    suffix_regexp_ = entire_regexp_->Incref();
  }

  // Two thirds of the memory goes to the forward Prog,
  // one third to the reverse prog, because the forward
  // Prog has two DFAs but the reverse prog has one.
  prog_ = suffix_regexp_->CompileToProg(options_.max_mem()*2/3);
  if (prog_ == NULL) {
    if (options_.log_errors())
      LOG(ERROR) << "Error compiling '" << trunc(*pattern_) << "'";
    error_ = new std::string("pattern too large - compile failed");
    error_code_ = RE2::ErrorPatternTooLarge;
    return;
  }

  // We used to compute this lazily, but it's used during the
  // typical control flow for a match call, so we now compute
  // it eagerly, which avoids the overhead of std::once_flag.
  num_captures_ = suffix_regexp_->NumCaptures();

  // Could delay this until the first match call that
  // cares about submatch information, but the one-pass
  // machine's memory gets cut from the DFA memory budget,
  // and that is harder to do if the DFA has already
  // been built.
  is_one_pass_ = prog_->IsOnePass();
}